

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

void bam_plp_destroy(bam_plp_t iter)

{
  olap_hash_t *__ptr;
  mempool_t *__ptr_00;
  int k;
  long lVar1;
  
  __ptr = iter->overlaps;
  if (__ptr != (olap_hash_t *)0x0) {
    free(__ptr->keys);
    free(__ptr->flags);
    free(__ptr->vals);
    free(__ptr);
  }
  mp_free(iter->mp,iter->dummy);
  mp_free(iter->mp,iter->head);
  __ptr_00 = iter->mp;
  if (__ptr_00->cnt != 0) {
    fprintf(_stderr,"[bam_plp_destroy] memory leak: %d. Continue anyway.\n");
    __ptr_00 = iter->mp;
  }
  for (lVar1 = 0; lVar1 < __ptr_00->n; lVar1 = lVar1 + 1) {
    free((__ptr_00->buf[lVar1]->b).data);
    free(__ptr_00->buf[lVar1]);
  }
  free(__ptr_00->buf);
  free(__ptr_00);
  if (iter->b != (bam1_t *)0x0) {
    bam_destroy1(iter->b);
  }
  free(iter->plp);
  free(iter);
  return;
}

Assistant:

void bam_plp_destroy(bam_plp_t iter)
{
    if ( iter->overlaps ) kh_destroy(olap_hash, iter->overlaps);
    mp_free(iter->mp, iter->dummy);
    mp_free(iter->mp, iter->head);
    if (iter->mp->cnt != 0)
        fprintf(stderr, "[bam_plp_destroy] memory leak: %d. Continue anyway.\n", iter->mp->cnt);
    mp_destroy(iter->mp);
    if (iter->b) bam_destroy1(iter->b);
    free(iter->plp);
    free(iter);
}